

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# templated_column_writer.hpp
# Opt level: O3

unique_ptr<duckdb::ColumnWriterPageState,_std::default_delete<duckdb::ColumnWriterPageState>,_true>
__thiscall
duckdb::StandardColumnWriter<duckdb::dtime_tz_t,_long,_duckdb::ParquetTimeTZOperator>::
InitializePageState(StandardColumnWriter<duckdb::dtime_tz_t,_long,_duckdb::ParquetTimeTZOperator>
                    *this,PrimitiveColumnWriterState *state_p,idx_t page_idx)

{
  idx_t iVar1;
  idx_t iVar2;
  idx_t iVar3;
  reference pvVar4;
  StandardWriterPageState<duckdb::dtime_tz_t,_long,_duckdb::ParquetTimeTZOperator> *this_00;
  size_type in_RCX;
  
  pvVar4 = vector<duckdb::PageInformation,_true>::operator[]
                     ((vector<duckdb::PageInformation,_true> *)(page_idx + 0x88),in_RCX);
  iVar1 = pvVar4->row_count;
  iVar2 = pvVar4->empty_count;
  iVar3 = pvVar4->null_count;
  this_00 = (StandardWriterPageState<duckdb::dtime_tz_t,_long,_duckdb::ParquetTimeTZOperator> *)
            operator_new(0x9908);
  StandardWriterPageState<duckdb::dtime_tz_t,_long,_duckdb::ParquetTimeTZOperator>::
  StandardWriterPageState
            (this_00,iVar1 - (iVar2 + iVar3),*(idx_t *)(page_idx + 0xd8),*(type *)(page_idx + 0x188)
             ,(PrimitiveDictionary<duckdb::dtime_tz_t,_long,_duckdb::ParquetTimeTZOperator> *)
              (page_idx + 0xe8));
  (this->super_PrimitiveColumnWriter).super_ColumnWriter._vptr_ColumnWriter = (_func_int **)this_00;
  return (unique_ptr<duckdb::ColumnWriterPageState,_std::default_delete<duckdb::ColumnWriterPageState>_>
          )(unique_ptr<duckdb::ColumnWriterPageState,_std::default_delete<duckdb::ColumnWriterPageState>_>
            )this;
}

Assistant:

unique_ptr<ColumnWriterPageState> InitializePageState(PrimitiveColumnWriterState &state_p,
	                                                      idx_t page_idx) override {
		auto &state = state_p.Cast<StandardColumnWriterState<SRC, TGT, OP>>();
		const auto &page_info = state_p.page_info[page_idx];
		auto result = make_uniq<StandardWriterPageState<SRC, TGT, OP>>(
		    page_info.row_count - (page_info.empty_count + page_info.null_count), state.total_string_size,
		    state.encoding, state.dictionary);
		return std::move(result);
	}